

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

stumpless_target * stumpless_set_option(stumpless_target *target,int option)

{
  int option_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    lock_target(target);
    target->options = option | target->options;
    unlock_target(target);
    clear_error();
    target_local = target;
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_option( struct stumpless_target *target, int option ) {
  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  target->options |= option;
  unlock_target( target );

  clear_error(  );
  return target;
}